

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::DecimalQuantity::setDigitPos
          (DecimalQuantity *this,int32_t position,int8_t value)

{
  byte bVar1;
  int shift;
  int8_t value_local;
  int32_t position_local;
  DecimalQuantity *this_local;
  
  if ((this->usingBytes & 1U) == 0) {
    if (position < 0x10) {
      bVar1 = (byte)(position << 2);
      (this->fBCD).bcdLong =
           (this->fBCD).bcdLong & (0xfL << (bVar1 & 0x3f) ^ 0xffffffffffffffffU) |
           (long)value << (bVar1 & 0x3f);
    }
    else {
      switchStorage(this);
      ensureCapacity(this,position + 1);
      (this->fBCD).bcdBytes.ptr[position] = value;
    }
  }
  else {
    ensureCapacity(this,position + 1);
    (this->fBCD).bcdBytes.ptr[position] = value;
  }
  return;
}

Assistant:

void DecimalQuantity::setDigitPos(int32_t position, int8_t value) {
    U_ASSERT(position >= 0);
    if (usingBytes) {
        ensureCapacity(position + 1);
        fBCD.bcdBytes.ptr[position] = value;
    } else if (position >= 16) {
        switchStorage();
        ensureCapacity(position + 1);
        fBCD.bcdBytes.ptr[position] = value;
    } else {
        int shift = position * 4;
        fBCD.bcdLong = (fBCD.bcdLong & ~(0xfL << shift)) | ((long) value << shift);
    }
}